

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int make_table_recurse(archive_read *a,huffman_code *code,int node,huffman_table_entry *table,
                      int depth,int maxdepth)

{
  int iVar1;
  uint uVar2;
  uint local_44;
  int local_40;
  int ret;
  int i;
  int currtablesize;
  int maxdepth_local;
  int depth_local;
  huffman_table_entry *table_local;
  int node_local;
  huffman_code *code_local;
  archive_read *a_local;
  
  local_44 = 0;
  if (code->tree == (huffman_tree_node *)0x0) {
    archive_set_error(&a->archive,0x54,"Huffman tree was not created.");
    a_local._4_4_ = 0xffffffe2;
  }
  else if ((node < 0) || (code->numentries <= node)) {
    archive_set_error(&a->archive,0x54,"Invalid location to Huffman tree specified.");
    a_local._4_4_ = 0xffffffe2;
  }
  else {
    iVar1 = 1 << ((char)maxdepth - (char)depth & 0x1fU);
    if (code->tree[node].branches[0] == code->tree[node].branches[1]) {
      for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
        table[local_40].length = depth;
        table[local_40].value = code->tree[node].branches[0];
      }
    }
    else if (depth == maxdepth) {
      table->length = maxdepth + 1;
      table->value = node;
    }
    else {
      uVar2 = make_table_recurse(a,code,code->tree[node].branches[0],table,depth + 1,maxdepth);
      local_44 = make_table_recurse(a,code,code->tree[node].branches[1],table + iVar1 / 2,depth + 1,
                                    maxdepth);
      local_44 = local_44 | uVar2;
    }
    a_local._4_4_ = local_44;
  }
  return a_local._4_4_;
}

Assistant:

static int
make_table_recurse(struct archive_read *a, struct huffman_code *code, int node,
                   struct huffman_table_entry *table, int depth,
                   int maxdepth)
{
  int currtablesize, i, ret = (ARCHIVE_OK);

  if (!code->tree)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Huffman tree was not created.");
    return (ARCHIVE_FATAL);
  }
  if (node < 0 || node >= code->numentries)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid location to Huffman tree specified.");
    return (ARCHIVE_FATAL);
  }

  currtablesize = 1 << (maxdepth - depth);

  if (code->tree[node].branches[0] ==
    code->tree[node].branches[1])
  {
    for(i = 0; i < currtablesize; i++)
    {
      table[i].length = depth;
      table[i].value = code->tree[node].branches[0];
    }
  }
  /*
   * Dead code, node >= 0
   *
  else if (node < 0)
  {
    for(i = 0; i < currtablesize; i++)
      table[i].length = -1;
  }
   */
  else
  {
    if(depth == maxdepth)
    {
      table[0].length = maxdepth + 1;
      table[0].value = node;
    }
    else
    {
      ret |= make_table_recurse(a, code, code->tree[node].branches[0], table,
                                depth + 1, maxdepth);
      ret |= make_table_recurse(a, code, code->tree[node].branches[1],
                         table + currtablesize / 2, depth + 1, maxdepth);
    }
  }
  return ret;
}